

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O0

void __thiscall
QStringBuilder<QString,_QString>::~QStringBuilder(QStringBuilder<QString,_QString> *this)

{
  QString::~QString((QString *)0x121830);
  QString::~QString((QString *)0x12183a);
  return;
}

Assistant:

~QStringBuilder() = default;